

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

int Timidity::convert_vibrato_sweep(Renderer *song,BYTE sweep,int vib_control_ratio)

{
  int vib_control_ratio_local;
  BYTE sweep_local;
  Renderer *song_local;
  
  if (sweep == '\0') {
    song_local._4_4_ = 0;
  }
  else {
    song_local._4_4_ =
         (int)(((float)vib_control_ratio * 38.0 * 65536.0) / (song->rate * (float)sweep));
  }
  return song_local._4_4_;
}

Assistant:

int convert_vibrato_sweep(Renderer *song, BYTE sweep, int vib_control_ratio)
{
	if (sweep == 0)
		return 0;

	return
		(int) (FSCALE((double) (vib_control_ratio) * SWEEP_TUNING, SWEEP_SHIFT) / (song->rate * sweep));

	/* this was overflowing with seashore.pat

	((vib_control_ratio * SWEEP_TUNING) << SWEEP_SHIFT) / (song->rate * sweep);
	*/
}